

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O0

void SyncBlockcStatement_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  bool bVar1;
  int iVar2;
  JsVm *pJVar3;
  __jmp_buf_tag *__env;
  JsValue *e_00;
  jmp_buf *jmp_buf0;
  undefined1 local_68 [4];
  int done0;
  JsValue v1;
  JsValue v0;
  JsValue *e;
  JsObject *lockObj;
  JsAstSyncBlockStatementNode *n;
  JsValue *res_local;
  JsContext *context_local;
  JsAstNode *na_local;
  
  context->pc = na->location;
  pJVar3 = JsGetVm();
  if ((pJVar3->debug == 1) && (pJVar3 = JsGetVm(), pJVar3->trace != (JsVmTraceFn)0x0)) {
    pJVar3 = JsGetVm();
    (*pJVar3->trace)(context->engine,na->location,JS_TRACE_STATEMENT);
  }
  e = (JsValue *)0x0;
  if (na[1].astClass == NODECLASS_None) {
    e = (JsValue *)context->thisObj;
  }
  else if (na[1].astClass == NODECLASS_Unary) {
    JsFindValueRef(context,(char *)na[1].location,(JsValue *)((long)&v1.u + 8));
    JsGetValue((JsValue *)((long)&v1.u + 8),(JsValue *)local_68);
    if ((local_68 != (undefined1  [4])0x5) || (v1._0_8_ == 0)) {
      JsThrowString("ident is\'t a object");
    }
    e = (JsValue *)v1._0_8_;
  }
  else {
    JsThrowString("synchronzied syntax error");
  }
  JsLockup((e->u).reference.name);
  __env = (__jmp_buf_tag *)JsMalloc(200);
  jmp_buf0._4_4_ = 0;
  while( true ) {
    bVar1 = false;
    if (jmp_buf0._4_4_ == 0) {
      iVar2 = _setjmp(__env);
      if (iVar2 != 0) {
        JsOmitDefender();
      }
      else {
        JsBuildDefender(__env);
      }
      bVar1 = iVar2 == 0;
    }
    if (!bVar1) break;
    (*JsNodeClassEval[**(uint **)(na + 2)])(*(JsAstNode **)(na + 2),context,res);
    jmp_buf0._4_4_ = jmp_buf0._4_4_ + 1;
    JsOmitDefender();
  }
  e_00 = JsCatchException();
  if (e_00 == (JsValue *)0x0) {
    JsUnlock((e->u).reference.name);
  }
  else {
    JsUnlock((e->u).reference.name);
    JsReThrowException(e_00);
  }
  return;
}

Assistant:

static void SyncBlockcStatement_eval(struct JsAstNode *na, 
        struct JsContext *context, struct JsValue *res){
		
	struct JsAstSyncBlockStatementNode *n = CAST_NODE(na, JsAstSyncBlockStatementNode);	
	TRACE(na->location, context, JS_TRACE_STATEMENT);
	
	struct JsObject* lockObj = NULL;
	struct JsValue* e = NULL;
	struct JsValue v0,v1;
	if(n->type == JS_SYNC_THIS_BLOCK_NODE){
		//this block
		lockObj = context->thisObj;
		
	}else if(n->type == JS_SYNC_IDENT_BLOCK_NODE){
		JsFindValueRef(context,n->ident,&v0);
		JsGetValue(&v0,&v1);
		if(v1.type != JS_OBJECT || v1.u.object == NULL){
			JsThrowString("ident is't a object");
		}
		lockObj = v1.u.object;
	}else{
		JsThrowString("synchronzied syntax error");
	}
	//对Block加锁
	JsLockup(lockObj->SyncLock);
	JS_TRY(0){
		EVAL(n->a,context,res);
	}
	JS_CATCH(e){
		//如果期间发现异常, 则先解锁, 在抛出
		JsUnlock(lockObj->SyncLock);
		JsReThrowException(e);
		return;
	}
	//对Block解锁
	JsUnlock(lockObj->SyncLock);
	return;
	
}